

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

int lua_getinfo(lua_State *L,char *what,lua_Debug *ar)

{
  StkId pTVar1;
  undefined4 uVar2;
  int iVar3;
  char *pcVar4;
  Closure *local_50;
  TValue *io1;
  StkId func;
  CallInfo *ci;
  Closure *cl;
  int status;
  lua_Debug *ar_local;
  char *what_local;
  lua_State *L_local;
  
  swapextra(L);
  if (*what == '>') {
    func = (StkId)0x0;
    io1 = L->top + -1;
    ar_local = (lua_Debug *)(what + 1);
    L->top = L->top + -1;
  }
  else {
    func = (StkId)ar->i_ci;
    io1 = ((CallInfo *)func)->func;
    ar_local = (lua_Debug *)what;
  }
  if ((io1->tt_ & 0x1fU) == 6) {
    local_50 = (Closure *)(io1->value_).gc;
  }
  else {
    local_50 = (Closure *)0x0;
  }
  iVar3 = auxgetinfo(L,(char *)ar_local,ar,local_50,(CallInfo *)func);
  pcVar4 = strchr((char *)ar_local,0x66);
  if (pcVar4 != (char *)0x0) {
    pTVar1 = L->top;
    pTVar1->value_ = io1->value_;
    uVar2 = *(undefined4 *)&io1->field_0xc;
    pTVar1->tt_ = io1->tt_;
    *(undefined4 *)&pTVar1->field_0xc = uVar2;
    L->top = L->top + 1;
  }
  swapextra(L);
  pcVar4 = strchr((char *)ar_local,0x4c);
  if (pcVar4 != (char *)0x0) {
    collectvalidlines(L,local_50);
  }
  return iVar3;
}

Assistant:

LUA_API int lua_getinfo (lua_State *L, const char *what, lua_Debug *ar) {
  int status;
  Closure *cl;
  CallInfo *ci;
  StkId func;
  lua_lock(L);
  swapextra(L);
  if (*what == '>') {
    ci = NULL;
    func = L->top - 1;
    api_check(L, ttisfunction(func), "function expected");
    what++;  /* skip the '>' */
    L->top--;  /* pop function */
  }
  else {
    ci = ar->i_ci;
    func = ci->func;
    lua_assert(ttisfunction(ci->func));
  }
  cl = ttisclosure(func) ? clvalue(func) : NULL;
  status = auxgetinfo(L, what, ar, cl, ci);
  if (strchr(what, 'f')) {
    setobjs2s(L, L->top, func);
    api_incr_top(L);
  }
  swapextra(L);  /* correct before option 'L', which can raise a mem. error */
  if (strchr(what, 'L'))
    collectvalidlines(L, cl);
  lua_unlock(L);
  return status;
}